

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

char * __thiscall Bstrlib::CBString::gets(CBString *this,char *__s)

{
  bstring x;
  char *pcVar1;
  CBStringException *this_00;
  char in_CL;
  void *in_RDX;
  allocator local_59;
  string local_58;
  CBStringException bstr__cppwrapper_exception;
  
  if (0 < (this->super_tagbstring).mlen) {
    x = bgets((bNgetc)__s,in_RDX,in_CL);
    if (x == (bstring)0x0) {
      (this->super_tagbstring).slen = 0;
      pcVar1 = (char *)0xffffffffffffffff;
    }
    else {
      operator=(this,x);
      bdestroy(x);
      pcVar1 = (char *)0x0;
    }
    return pcVar1;
  }
  std::__cxx11::string::string((string *)&local_58,"CBString::Write protection error",&local_59);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

int CBString::gets (bNgetc getcPtr, void * parm, char terminator) {
	if (mlen <= 0) bstringThrow ("Write protection error");
	bstring b = bgets (getcPtr, parm, terminator);
	if (b == NULL) {
		slen = 0;
		return -1;
	}
	*this = *b;
	bdestroy (b);
	return 0;
}